

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O3

Node * __thiscall State::SpellcheckNode(State *this,string *path)

{
  int iVar1;
  int iVar2;
  _Hash_node_base *p_Var3;
  Node *pNVar4;
  StringPiece local_38;
  
  p_Var3 = (this->paths_)._M_h._M_before_begin._M_nxt;
  if (p_Var3 == (_Hash_node_base *)0x0) {
    pNVar4 = (Node *)0x0;
  }
  else {
    iVar2 = 4;
    pNVar4 = (Node *)0x0;
    do {
      local_38.str_ = (path->_M_dataplus)._M_p;
      local_38.len_ = path->_M_string_length;
      iVar1 = EditDistance((StringPiece *)(p_Var3 + 1),&local_38,true,3);
      if ((iVar1 < iVar2) && ((Node *)p_Var3[3]._M_nxt != (Node *)0x0)) {
        pNVar4 = (Node *)p_Var3[3]._M_nxt;
        iVar2 = iVar1;
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return pNVar4;
}

Assistant:

Node* State::SpellcheckNode(const string& path) {
  const bool kAllowReplacements = true;
  const int kMaxValidEditDistance = 3;

  int min_distance = kMaxValidEditDistance + 1;
  Node* result = NULL;
  for (Paths::iterator i = paths_.begin(); i != paths_.end(); ++i) {
    int distance = EditDistance(
        i->first, path, kAllowReplacements, kMaxValidEditDistance);
    if (distance < min_distance && i->second) {
      min_distance = distance;
      result = i->second;
    }
  }
  return result;
}